

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O2

TestLog * deqp::gles3::Functional::DepthStencilCaseUtil::operator<<
                    (TestLog *log,DepthStencilParams *params)

{
  ostringstream *poVar1;
  ostringstream *this;
  char *pcVar2;
  MessageBuilder *this_00;
  char *pcVar3;
  Enum<int,_2UL> local_1b8;
  MessageBuilder local_1a8;
  
  poVar1 = &local_1a8.m_str;
  local_1a8.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Stencil test: ");
  pcVar3 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  pcVar2 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if (params->stencilTestEnabled != false) {
    pcVar2 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::operator<<((ostream *)poVar1,pcVar2 + 0x27);
  tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (params->stencilTestEnabled == true) {
    poVar1 = &local_1a8.m_str;
    local_1a8.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Front-face stencil state: ");
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    operator<<(log,params->stencil);
    poVar1 = &local_1a8.m_str;
    local_1a8.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Back-face stencil state: ");
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    operator<<(log,params->stencil + 1);
  }
  poVar1 = &local_1a8.m_str;
  local_1a8.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Depth test: ");
  if (params->depthTestEnabled != false) {
    pcVar3 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::operator<<((ostream *)poVar1,pcVar3 + 0x27);
  tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (params->depthTestEnabled == true) {
    this = &local_1a8.m_str;
    local_1a8.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"  func = ");
    local_1b8.m_value = params->depthFunc;
    local_1b8.m_getName = glu::getCompareFuncName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this);
    std::operator<<((ostream *)this,"\n  depth value = ");
    this_00 = tcu::MessageBuilder::operator<<(&local_1a8,&params->depth);
    poVar1 = &this_00->m_str;
    std::operator<<((ostream *)poVar1,"\n  write mask = ");
    pcVar3 = "false";
    if (params->depthWriteMask != false) {
      pcVar3 = "true";
    }
    std::operator<<((ostream *)poVar1,pcVar3);
    std::operator<<((ostream *)poVar1,"\n");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  }
  poVar1 = &local_1a8.m_str;
  local_1a8.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Triangles are ");
  pcVar3 = "back";
  if (params->visibleFace == FACETYPE_FRONT) {
    pcVar3 = "front";
  }
  std::operator<<((ostream *)poVar1,pcVar3);
  std::operator<<((ostream *)poVar1,"-facing");
  tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const DepthStencilParams& params)
{
	log << TestLog::Message << "Stencil test: " << (params.stencilTestEnabled ? "enabled" : "disabled") << TestLog::EndMessage;
	if (params.stencilTestEnabled)
	{
		log << TestLog::Message << "Front-face stencil state: " << TestLog::EndMessage;
		log << params.stencil[rr::FACETYPE_FRONT];

		log << TestLog::Message << "Back-face stencil state: " << TestLog::EndMessage;
		log << params.stencil[rr::FACETYPE_BACK];
	}

	log << TestLog::Message << "Depth test: " << (params.depthTestEnabled ? "enabled" : "disabled") << TestLog::EndMessage;
	if (params.depthTestEnabled)
	{
		log << TestLog::Message << "  func = " << glu::getCompareFuncStr(params.depthFunc) << "\n"
								   "  depth value = " << params.depth << "\n"
								   "  write mask = " << (params.depthWriteMask ? "true" : "false") << "\n"
			<< TestLog::EndMessage;
	}

	log << TestLog::Message << "Triangles are " << (params.visibleFace == rr::FACETYPE_FRONT ? "front" : "back") << "-facing" << TestLog::EndMessage;

	return log;
}